

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,2,4>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  bool *pbVar1;
  ostringstream *poVar2;
  _Rb_tree_node_base *p_Var3;
  pointer pMVar4;
  pointer pMVar5;
  Variable<tcu::Matrix<float,_2,_4>_> *pVVar6;
  pointer pcVar7;
  double dVar8;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>_>_>
  *pVVar9;
  FloatFormat *fmt;
  pointer pSVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  ContextType type;
  int iVar14;
  uint uVar15;
  _Rb_tree_node_base *p_Var16;
  char *__s;
  size_t sVar17;
  long *plVar18;
  ShaderExecutor *pSVar19;
  IVal *pIVar20;
  TestError *this_00;
  TestLog *pTVar21;
  Matrix<float,_2,_4> *val;
  string *psVar22;
  undefined1 *puVar23;
  _Rb_tree_node_base **pp_Var24;
  undefined8 *puVar25;
  PrecisionCase *pPVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  IVal in2;
  IVal in3;
  ostringstream os;
  FloatFormat highpFmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>_>_>
  outputs;
  Environment env;
  IVal in1;
  ShaderSpec spec;
  ostringstream oss;
  FuncSet funcs;
  undefined1 auStack_648 [8];
  PrecisionCase *local_640;
  string local_638;
  ulong local_618;
  size_t local_610;
  Statement *local_608;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>_>_>
  *local_600;
  string local_5f8;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_5d8;
  ResultCollector *local_5d0;
  long local_5c8;
  ulong local_5c0;
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [16];
  Vector<float,_2> local_598;
  Data local_590;
  undefined4 local_580;
  ios_base local_548 [8];
  ios_base local_540 [264];
  FloatFormat local_438;
  ulong local_410;
  FloatFormat *local_408;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>_>_>
  local_400;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_3d0;
  undefined1 local_3a0 [16];
  undefined1 local_390 [184];
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  local_2d8;
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  vStack_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2a8;
  undefined8 local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_288;
  undefined8 local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  undefined1 local_268 [24];
  undefined8 local_250 [11];
  ios_base local_1f8 [264];
  undefined1 local_f0 [16];
  _Base_ptr local_e0;
  _Rb_tree_node_base *local_d8;
  _Rb_tree_node_base *local_d0;
  double local_c8;
  
  pMVar4 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar5 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_610 = (long)pMVar5 - (long)pMVar4 >> 5;
  local_608 = stmt;
  local_5d8 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>_>_>
  ::Outputs(&local_400,local_610);
  local_2a8 = &local_298;
  local_390._176_4_ = 1;
  local_2d8.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_2c0.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_2c0.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_2c0.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a0 = 0;
  local_298._M_local_buf[0] = '\0';
  local_288 = &local_278;
  local_280 = 0;
  local_278._M_local_buf[0] = '\0';
  local_438.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_438.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_438.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_438.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_438.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_438.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_438.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_438.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_438._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_3d0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3d0._M_impl.super__Rb_tree_header._M_header;
  local_3d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3d0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_5b8._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_5b8 + 8);
  local_3d0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3d0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Statement: ",0xb);
  (*local_608->_vptr_Statement[2])(local_608,poVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_5b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_640 = this;
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_540);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
  p_Var3 = (_Rb_tree_node_base *)(local_f0 + 8);
  local_f0._8_4_ = _S_red;
  local_e0 = (_Base_ptr)0x0;
  local_c8 = 0.0;
  local_d8 = p_Var3;
  local_d0 = p_Var3;
  (*local_608->_vptr_Statement[4])(local_608,local_f0);
  if (local_d8 != p_Var3) {
    p_Var16 = local_d8;
    do {
      (**(code **)(**(long **)(p_Var16 + 1) + 0x30))(*(long **)(p_Var16 + 1),local_268);
      p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
    } while (p_Var16 != p_Var3);
  }
  pPVar26 = local_640;
  if (local_c8 != 0.0) {
    local_5b8._0_8_ = ((local_640->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_5b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,(char *)local_3a0._0_8_,local_3a0._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_5b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_3a0._0_8_ != (IVal *)local_390) {
      operator_delete((void *)local_3a0._0_8_,local_390._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_540);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
  std::ios_base::~ios_base(local_1f8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8,"precision ",10);
  __s = glu::getPrecisionName((pPVar26->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_648 + (long)((TestLog *)(local_5b8._0_8_ + -0x18))->m_log) + 0x90)
    ;
  }
  else {
    sVar17 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8,__s,sVar17);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2a8,(string *)local_268);
  pcVar7 = local_268 + 0x10;
  if ((pointer)local_268._0_8_ != pcVar7) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
  std::ios_base::~ios_base(local_548);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_640->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_390._176_4_ = glu::getContextTypeGLSLVersion(type);
  local_600 = variables;
  if ((local_640->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                   "#extension ",&local_640->m_extension);
    plVar18 = (long *)std::__cxx11::string::append(local_268);
    pTVar21 = (TestLog *)(plVar18 + 2);
    if ((TestLog *)*plVar18 == pTVar21) {
      local_5a8._0_8_ = pTVar21->m_log;
      local_5a8._8_8_ = plVar18[3];
      local_5b8._0_8_ = (TestLog *)local_5a8;
    }
    else {
      local_5a8._0_8_ = pTVar21->m_log;
      local_5b8._0_8_ = (TestLog *)*plVar18;
    }
    local_5b8._8_8_ = plVar18[1];
    *plVar18 = (long)pTVar21;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_2a8,(string *)local_5b8);
    if ((TestLog *)local_5b8._0_8_ != (TestLog *)local_5a8) {
      operator_delete((void *)local_5b8._0_8_,(ulong)(local_5a8._0_8_ + 1));
    }
    variables = local_600;
    if ((pointer)local_268._0_8_ != pcVar7) {
      operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize(&local_2d8,1);
  makeSymbol<tcu::Matrix<float,2,4>>
            ((Symbol *)local_5b8,local_640,
             (variables->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
             .m_ptr);
  pSVar10 = local_2d8.
            super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=
            ((string *)
             local_2d8.
             super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             ._M_impl.super__Vector_impl_data._M_start,(string *)local_5b8);
  glu::VarType::operator=(&pSVar10->varType,(VarType *)&local_598);
  glu::VarType::~VarType((VarType *)&local_598);
  if ((TestLog *)local_5b8._0_8_ != (TestLog *)local_5a8) {
    operator_delete((void *)local_5b8._0_8_,(ulong)(local_5a8._0_8_ + 1));
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize(&vStack_2c0,2);
  makeSymbol<tcu::Matrix<float,2,4>>
            ((Symbol *)local_5b8,local_640,
             (variables->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
             .m_ptr);
  pSVar10 = vStack_2c0.
            super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=
            ((string *)
             (vStack_2c0.
              super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start + 1),(string *)local_5b8);
  glu::VarType::operator=(&pSVar10[1].varType,(VarType *)&local_598);
  glu::VarType::~VarType((VarType *)&local_598);
  if ((TestLog *)local_5b8._0_8_ != (TestLog *)local_5a8) {
    operator_delete((void *)local_5b8._0_8_,(ulong)(local_5a8._0_8_ + 1));
  }
  makeSymbol<tcu::Matrix<float,2,4>>
            ((Symbol *)local_5b8,local_640,
             (variables->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
             .m_ptr);
  pSVar10 = vStack_2c0.
            super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=
            ((string *)
             vStack_2c0.
             super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             ._M_impl.super__Vector_impl_data._M_start,(string *)local_5b8);
  glu::VarType::operator=(&pSVar10->varType,(VarType *)&local_598);
  glu::VarType::~VarType((VarType *)&local_598);
  if ((TestLog *)local_5b8._0_8_ != (TestLog *)local_5a8) {
    operator_delete((void *)local_5b8._0_8_,(ulong)(local_5a8._0_8_ + 1));
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
  (*local_608->_vptr_Statement[2])(local_608,local_5b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
  std::ios_base::~ios_base(local_548);
  std::__cxx11::string::operator=((string *)&local_288,(string *)local_268);
  if ((pointer)local_268._0_8_ != pcVar7) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  pPVar26 = local_640;
  pSVar19 = ShaderExecUtil::createExecutor
                      ((local_640->m_ctx).renderContext,(local_640->m_ctx).shaderType,
                       (ShaderSpec *)(local_390 + 0xb0));
  local_5b8._0_8_ =
       (local_5d8->in0).
       super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_5b8._8_8_ =
       (local_5d8->in1).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_5a8._0_8_ =
       (local_5d8->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_5a8._8_8_ =
       (local_5d8->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_268._0_8_ =
       local_400.out0.
       super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_268._8_8_ =
       local_400.out1.
       super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (*pSVar19->_vptr_ShaderExecutor[3])
            (pSVar19,((pPVar26->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar14 = (*pSVar19->_vptr_ShaderExecutor[2])(pSVar19);
  if ((char)iVar14 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar19->_vptr_ShaderExecutor[5])(pSVar19);
  (*pSVar19->_vptr_ShaderExecutor[6])(pSVar19,local_610,local_5b8,local_268);
  (*pSVar19->_vptr_ShaderExecutor[1])(pSVar19);
  tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_5b8);
  tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_268);
  tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_f0);
  Environment::bind<tcu::Matrix<float,2,4>>
            ((Environment *)&local_3d0,
             (variables->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
             .m_ptr,(IVal *)local_5b8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_3d0,
             (variables->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_3a0);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_3d0,
             (variables->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_638);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_3d0,
             (variables->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_5f8);
  Environment::bind<tcu::Matrix<float,2,4>>
            ((Environment *)&local_3d0,
             (variables->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
             .m_ptr,(IVal *)local_268);
  Environment::bind<tcu::Matrix<float,2,4>>
            ((Environment *)&local_3d0,
             (variables->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
             .m_ptr,(IVal *)local_f0);
  if (pMVar5 == pMVar4) {
LAB_0073c059:
    local_5b8._0_8_ = ((pPVar26->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_5b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_5b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_408 = &(pPVar26->m_ctx).floatFormat;
    local_5d0 = &pPVar26->m_status;
    local_410 = local_610 + (local_610 == 0);
    local_5c8 = 0;
    uVar29 = 0;
    local_618 = 0;
    do {
      tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_268);
      tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_f0);
      local_5c0 = uVar29;
      if ((uVar29 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_640->super_TestCase).super_TestNode.m_testCtx);
      }
      fmt = local_408;
      pVVar9 = local_600;
      pMVar4 = (local_5d8->in0).
               super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_638.field_2._M_allocated_capacity = 0;
      local_638.field_2._8_8_ = 0;
      local_638._M_dataplus._M_p = (char *)0x0;
      local_638._M_string_length = 0;
      lVar27 = 0;
      psVar22 = &local_638;
      bVar11 = true;
      do {
        bVar13 = bVar11;
        lVar28 = 0;
        do {
          *(undefined4 *)&(&psVar22->_M_dataplus)[lVar28]._M_p =
               *(undefined4 *)
                ((long)(pMVar4->m_data).m_data[lVar28].m_data + lVar27 * 4 + local_5c8);
          lVar28 = lVar28 + 1;
        } while (lVar28 != 4);
        lVar27 = 1;
        psVar22 = (string *)((long)&local_638._M_dataplus._M_p + 4);
        bVar11 = false;
      } while (bVar13);
      ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doRound
                ((IVal *)local_3a0,local_408,(Matrix<float,_2,_4> *)&local_638);
      ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doConvert
                ((IVal *)local_5b8,fmt,(IVal *)local_3a0);
      pIVar20 = Environment::lookup<tcu::Matrix<float,2,4>>
                          ((Environment *)&local_3d0,
                           (pVVar9->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
                           .m_ptr);
      puVar23 = local_5b8;
      lVar27 = 0;
      bVar11 = true;
      do {
        bVar13 = bVar11;
        lVar28 = 0;
        do {
          *(undefined8 *)((long)&(pIVar20->m_data).m_data[0].m_data[lVar27].m_hi + lVar28) =
               *(undefined8 *)(puVar23 + lVar28 + 0x10);
          dVar8 = *(double *)((long)(puVar23 + lVar28) + 8);
          pbVar1 = &(pIVar20->m_data).m_data[0].m_data[lVar27].m_hasNaN + lVar28;
          *(undefined8 *)pbVar1 = *(undefined8 *)(puVar23 + lVar28);
          *(double *)(pbVar1 + 8) = dVar8;
          lVar28 = lVar28 + 0x30;
        } while (lVar28 != 0xc0);
        lVar27 = 1;
        puVar23 = local_5a8 + 8;
        bVar11 = false;
      } while (bVar13);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_3d0,
                 (pVVar9->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_3d0,
                 (pVVar9->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_3d0,
                 (pVVar9->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_590.basic.type = (local_640->m_ctx).precision;
      local_598.m_data = (float  [2])fmt->m_maxValue;
      local_5b8._0_8_ = *(undefined8 *)fmt;
      local_5b8._8_8_ = *(undefined8 *)&fmt->m_fractionBits;
      local_5a8._0_8_ = *(undefined8 *)&fmt->m_hasInf;
      local_5a8._8_8_ = *(undefined8 *)&fmt->m_exactPrecision;
      local_580 = 0;
      local_590._8_8_ = &local_3d0;
      (*local_608->_vptr_Statement[3])(local_608,(IVal *)local_5b8);
      pIVar20 = Environment::lookup<tcu::Matrix<float,2,4>>
                          ((Environment *)&local_3d0,
                           (pVVar9->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
                           .m_ptr);
      uVar29 = local_5c0;
      ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doConvert
                ((IVal *)local_5b8,&local_438,pIVar20);
      pp_Var24 = (_Rb_tree_node_base **)local_f0;
      pIVar20 = (IVal *)local_5b8;
      bVar11 = true;
      do {
        bVar13 = bVar11;
        lVar27 = 0;
        do {
          *(undefined8 *)((long)pp_Var24 + lVar27 + 0x10) =
               *(undefined8 *)((long)&(pIVar20->m_data).m_data[0].m_data[0].m_hi + lVar27);
          pbVar1 = &(pIVar20->m_data).m_data[0].m_data[0].m_hasNaN + lVar27;
          dVar8 = *(double *)(pbVar1 + 8);
          *(undefined8 *)((long)pp_Var24 + lVar27) = *(undefined8 *)pbVar1;
          ((undefined8 *)((long)pp_Var24 + lVar27))[1] = dVar8;
          lVar27 = lVar27 + 0x30;
        } while (lVar27 != 0xc0);
        pp_Var24 = &local_d8;
        pIVar20 = (IVal *)(local_5a8 + 8);
        bVar11 = false;
      } while (bVar13);
      bVar11 = contains<tcu::Matrix<float,2,4>>
                         ((IVal *)local_f0,
                          local_400.out1.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar29);
      local_5b8._0_8_ = local_5a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_5b8,"Shader output 1 is outside acceptable range","");
      bVar11 = tcu::ResultCollector::check(local_5d0,bVar11,(string *)local_5b8);
      if ((TestLog *)local_5b8._0_8_ != (TestLog *)local_5a8) {
        operator_delete((void *)local_5b8._0_8_,(ulong)(local_5a8._0_8_ + 1));
      }
      pIVar20 = Environment::lookup<tcu::Matrix<float,2,4>>
                          ((Environment *)&local_3d0,
                           (local_600->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doConvert
                ((IVal *)local_5b8,&local_438,pIVar20);
      puVar25 = (undefined8 *)local_268;
      pIVar20 = (IVal *)local_5b8;
      bVar13 = true;
      do {
        bVar12 = bVar13;
        lVar27 = 0;
        do {
          *(undefined8 *)((long)puVar25 + lVar27 + 0x10) =
               *(undefined8 *)((long)&(pIVar20->m_data).m_data[0].m_data[0].m_hi + lVar27);
          pbVar1 = &(pIVar20->m_data).m_data[0].m_data[0].m_hasNaN + lVar27;
          dVar8 = *(double *)(pbVar1 + 8);
          *(undefined8 *)((long)puVar25 + lVar27) = *(undefined8 *)pbVar1;
          ((undefined8 *)((long)puVar25 + lVar27))[1] = dVar8;
          lVar27 = lVar27 + 0x30;
        } while (lVar27 != 0xc0);
        puVar25 = local_250;
        pIVar20 = (IVal *)(local_5a8 + 8);
        bVar13 = false;
      } while (bVar12);
      bVar13 = contains<tcu::Matrix<float,2,4>>
                         ((IVal *)local_268,
                          local_400.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar29);
      local_5b8._0_8_ = local_5a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_5b8,"Shader output 0 is outside acceptable range","");
      bVar13 = tcu::ResultCollector::check(local_5d0,bVar13,(string *)local_5b8);
      if ((pointer)local_5b8._0_8_ != (pointer)local_5a8) {
        operator_delete((void *)local_5b8._0_8_,(ulong)(local_5a8._0_8_ + 1));
      }
      pVVar9 = local_600;
      if (!bVar11 || !bVar13) {
        uVar15 = (int)local_618 + 1;
        local_618 = (ulong)uVar15;
        poVar2 = (ostringstream *)(local_5b8 + 8);
        if ((int)uVar15 < 0x65) {
          local_5b8._0_8_ = ((local_640->super_TestCase).super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\t",1);
          pVVar6 = (pVVar9->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
                   .m_ptr;
          val = (Matrix<float,_2,_4> *)local_390;
          pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
          local_3a0._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3a0,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,(char *)local_3a0._0_8_,local_3a0._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," = ",3);
          valueToString<tcu::Matrix<float,2,4>>
                    (&local_638,(BuiltinPrecisionTests *)&local_438,
                     (FloatFormat *)
                     ((local_5d8->in0).
                      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar29),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,local_638._M_dataplus._M_p,local_638._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_638._M_dataplus._M_p != &local_638.field_2) {
            operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
          }
          if ((Matrix<float,_2,_4> *)local_3a0._0_8_ != (Matrix<float,_2,_4> *)local_390) {
            operator_delete((void *)local_3a0._0_8_,local_390._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\t",1);
          pVVar6 = (pVVar9->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
                   .m_ptr;
          pIVar20 = (IVal *)local_390;
          pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
          local_3a0._0_8_ = pIVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3a0,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,(char *)local_3a0._0_8_,local_3a0._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," = ",3);
          valueToString<tcu::Matrix<float,2,4>>
                    (&local_638,(BuiltinPrecisionTests *)&local_438,
                     (FloatFormat *)
                     (local_400.out0.
                      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar29),
                     (Matrix<float,_2,_4> *)pIVar20);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,local_638._M_dataplus._M_p,local_638._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,2,4>>
                    (&local_5f8,(BuiltinPrecisionTests *)&local_438,(FloatFormat *)local_268,pIVar20
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,local_5f8._M_dataplus._M_p,local_5f8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
            operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_638._M_dataplus._M_p != &local_638.field_2) {
            operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
          }
          if ((IVal *)local_3a0._0_8_ != (IVal *)local_390) {
            operator_delete((void *)local_3a0._0_8_,local_390._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\t",1);
          pVVar6 = (pVVar9->out1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
                   .m_ptr;
          pIVar20 = (IVal *)local_390;
          pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
          local_3a0._0_8_ = pIVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3a0,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,(char *)local_3a0._0_8_,local_3a0._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," = ",3);
          valueToString<tcu::Matrix<float,2,4>>
                    (&local_638,(BuiltinPrecisionTests *)&local_438,
                     (FloatFormat *)
                     (local_400.out1.
                      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar29),
                     (Matrix<float,_2,_4> *)pIVar20);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,local_638._M_dataplus._M_p,local_638._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,2,4>>
                    (&local_5f8,(BuiltinPrecisionTests *)&local_438,(FloatFormat *)local_f0,pIVar20)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,local_5f8._M_dataplus._M_p,local_5f8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
            operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_638._M_dataplus._M_p != &local_638.field_2) {
            operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
          }
          if ((IVal *)local_3a0._0_8_ != (IVal *)local_390) {
            operator_delete((void *)local_3a0._0_8_,local_390._0_8_ + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_5b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar2);
          std::ios_base::~ios_base(local_540);
        }
      }
      pPVar26 = local_640;
      uVar29 = local_5c0 + 1;
      local_5c8 = local_5c8 + 0x20;
    } while (uVar29 != local_410);
    if ((int)local_618 < 0x65) {
      if ((int)local_618 == 0) goto LAB_0073c059;
    }
    else {
      local_5b8._0_8_ = ((local_640->super_TestCase).super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_5b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"(Skipped ",9);
      std::ostream::operator<<(poVar2,(int)local_618 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_5b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_540);
    }
    local_5b8._0_8_ = ((pPVar26->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_5b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::ostream::operator<<(poVar2,(int)local_618);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_5b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_5b8 + 8));
  std::ios_base::~ios_base(local_540);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_3d0);
  if (local_288 != &local_278) {
    operator_delete(local_288,
                    CONCAT71(local_278._M_allocated_capacity._1_7_,local_278._M_local_buf[0]) + 1);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,
                    CONCAT71(local_298._M_allocated_capacity._1_7_,local_298._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector(&vStack_2c0);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector(&local_2d8);
  if (local_400.out1.
      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_400.out1.
                    super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_400.out1.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_400.out1.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_400.out0.
      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_400.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_400.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_400.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}